

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_2_to_1_phase_0
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,int dst_w,
               int dst_h)

{
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i d;
  int x;
  int y;
  __m128i mask;
  int max_width;
  uint local_a0;
  int local_9c;
  longlong local_98;
  longlong lStack_90;
  uint local_7c;
  long local_70;
  undefined8 *local_68;
  long local_60;
  uint8_t *local_58;
  undefined2 local_4a;
  undefined8 *local_30;
  longlong local_28;
  longlong lStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_7c = in_R8D + 0xfU & 0xfffffff0;
  local_4a = 0xff;
  local_2 = 0xff;
  local_4 = 0xff;
  local_6 = 0xff;
  local_8 = 0xff;
  local_a = 0xff;
  local_c = 0xff;
  local_e = 0xff;
  local_10 = 0xff;
  local_98 = 0xff00ff00ff00ff;
  lStack_90 = 0xff00ff00ff00ff;
  local_9c = in_R9D;
  local_70 = in_RCX;
  local_68 = in_RDX;
  local_60 = in_RSI;
  local_58 = in_RDI;
  local_28 = local_98;
  lStack_20 = lStack_90;
  do {
    local_a0 = local_7c;
    do {
      scale_plane_2_to_1_phase_0_kernel(local_58,(__m128i *)&local_98);
      local_30 = local_68;
      *local_68 = extraout_XMM0_Qa;
      local_68[1] = extraout_XMM0_Qb;
      local_58 = local_58 + 0x20;
      local_68 = local_68 + 2;
      local_a0 = local_a0 - 0x10;
    } while (local_a0 != 0);
    local_58 = local_58 + (local_60 - (int)local_7c) * 2;
    local_68 = (undefined8 *)((local_70 - (int)local_7c) + (long)local_68);
    local_9c = local_9c + -1;
  } while (local_9c != 0);
  return;
}

Assistant:

static void scale_plane_2_to_1_phase_0(const uint8_t *src,
                                       const ptrdiff_t src_stride, uint8_t *dst,
                                       const ptrdiff_t dst_stride,
                                       const int dst_w, const int dst_h) {
  const int max_width = (dst_w + 15) & ~15;
  const __m128i mask = _mm_set1_epi16(0x00FF);
  int y = dst_h;

  do {
    int x = max_width;
    do {
      const __m128i d = scale_plane_2_to_1_phase_0_kernel(src, &mask);
      _mm_storeu_si128((__m128i *)dst, d);
      src += 32;
      dst += 16;
      x -= 16;
    } while (x);
    src += 2 * (src_stride - max_width);
    dst += dst_stride - max_width;
  } while (--y);
}